

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_pronunciation.c
# Opt level: O0

int strtopcmp(char *str,char *pattern)

{
  int i;
  char *pattern_local;
  char *str_local;
  
  i = 0;
  while( true ) {
    if (pattern[i] == '\0') {
      return i;
    }
    if (str[i] == '\0') break;
    if (str[i] != pattern[i]) {
      return -1;
    }
    i = i + 1;
  }
  return -1;
}

Assistant:

static int strtopcmp(const char *str, const char *pattern)
{
   int i;

   for (i = 0;; i++) {
      if (pattern[i] == '\0')
         return i;
      if (str[i] == '\0')
         return -1;
      if (str[i] != pattern[i])
         return -1;
   }
}